

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

void __thiscall Omega_h::CallOp::CallOp(CallOp *this,string *name_in,Args *args_in)

{
  bool bVar1;
  size_type __n;
  undefined1 local_60 [8];
  OpPtr op;
  any *arg;
  const_iterator __end2;
  const_iterator __begin2;
  Args *__range2;
  Args *args_in_local;
  string *name_in_local;
  CallOp *this_local;
  
  ExprOp::ExprOp(&this->super_ExprOp);
  (this->super_ExprOp)._vptr_ExprOp = (_func_int **)&PTR__CallOp_007f5b90;
  std::__cxx11::string::string((string *)&this->name,(string *)name_in);
  std::vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ::vector(&this->rhs);
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::vector(&this->args);
  __end2 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::begin(args_in);
  arg = (any *)std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::end(args_in);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Omega_h::any_*,_std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_>
                                *)&arg);
    if (!bVar1) break;
    op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_Omega_h::any_*,_std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_>
         ::operator*(&__end2);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)local_60,
               (any *)op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi);
    std::
    vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>::
    push_back(&this->rhs,(value_type *)local_60);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_60);
    __gnu_cxx::
    __normal_iterator<const_Omega_h::any_*,_std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_>
    ::operator++(&__end2);
  }
  __n = std::
        vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
        ::size(&this->rhs);
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::reserve(&this->args,__n);
  return;
}

Assistant:

CallOp(std::string const& name_in, ExprEnv::Args const& args_in)
      : name(name_in) {
    for (auto& arg : args_in) {
      OpPtr op = any_cast<OpPtr>(arg);
      rhs.push_back(op);
    }
    args.reserve(rhs.size());
  }